

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  parasail_result_t *ppVar13;
  __m128i *palVar14;
  __m128i *ptr;
  __m128i *ptr_00;
  int32_t *ptr_01;
  int iVar15;
  uint uVar16;
  int32_t iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  int32_t segNum;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  ulong size;
  long lVar31;
  ulong uVar32;
  __m128i *ptr_02;
  long lVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  __m128i alVar43;
  undefined1 auVar44 [16];
  int iVar49;
  int iVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar51;
  int iVar58;
  int iVar59;
  undefined1 in_XMM9 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar60;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar61;
  int iVar65;
  int iVar66;
  int iVar67;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i_32_t e;
  __m128i_32_t h;
  int local_f4;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse2_128_32_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse2_128_32_cold_4();
        }
        else {
          uVar18 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_sse2_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_32_cold_1();
          }
          else {
            iVar9 = uVar3 - 1;
            uVar1 = (ulong)uVar3 + 3;
            size = uVar1 >> 2;
            uVar30 = (uint)size;
            iVar10 = iVar9 / (int)uVar30;
            uVar16 = iVar9 % (int)uVar30;
            iVar19 = -open;
            iVar11 = ppVar5->min;
            uVar21 = 0x80000000 - iVar11;
            if (iVar11 != iVar19 && SBORROW4(iVar11,iVar19) == iVar11 + open < 0) {
              uVar21 = open | 0x80000000;
            }
            iVar11 = 0x7ffffffe - ppVar5->max;
            ppVar13 = parasail_result_new_table1((uint)uVar1 & 0x7ffffffc,s2Len);
            if (ppVar13 != (parasail_result_t *)0x0) {
              ppVar13->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x4420802;
              palVar14 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              uVar32 = 0;
              if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (ptr != (__m128i *)0x0 && palVar14 != (__m128i *)0x0)) {
                iVar12 = s2Len + -1;
                iVar15 = 3 - iVar10;
                iVar29 = uVar21 + 1;
                auVar36._4_4_ = iVar29;
                auVar36._0_4_ = iVar29;
                auVar36._8_4_ = iVar29;
                auVar36._12_4_ = iVar29;
                auVar71._4_4_ = iVar11;
                auVar71._0_4_ = iVar11;
                auVar71._8_4_ = iVar11;
                auVar71._12_4_ = iVar11;
                iVar22 = iVar19;
                do {
                  lVar26 = 0;
                  iVar23 = iVar22;
                  do {
                    iVar20 = 0;
                    if (s1_beg == 0) {
                      iVar20 = iVar23;
                    }
                    *(int *)((long)&local_48 + lVar26 * 4) = iVar20;
                    lVar27 = (long)iVar20 - (ulong)(uint)open;
                    if (lVar27 < -0x7fffffff) {
                      lVar27 = -0x80000000;
                    }
                    *(int *)((long)&local_58 + lVar26 * 4) = (int)lVar27;
                    lVar26 = lVar26 + 1;
                    iVar23 = iVar23 - gap * uVar30;
                  } while (lVar26 != 4);
                  palVar14[uVar32][0] = local_48;
                  palVar14[uVar32][1] = lStack_40;
                  ptr_00[uVar32][0] = local_58;
                  ptr_00[uVar32][1] = lStack_50;
                  uVar32 = uVar32 + 1;
                  iVar22 = iVar22 - gap;
                } while (uVar32 != size);
                *ptr_01 = 0;
                uVar32 = 1;
                iVar22 = iVar19;
                do {
                  iVar17 = 0;
                  if (s2_beg == 0) {
                    iVar17 = iVar22;
                  }
                  ptr_01[uVar32] = iVar17;
                  uVar32 = uVar32 + 1;
                  iVar22 = iVar22 - gap;
                } while (s2Len + 1 != uVar32);
                uVar32 = 1;
                if (1 < s2Len) {
                  uVar32 = uVar18;
                }
                lVar27 = size * uVar18;
                lVar28 = (ulong)(uVar30 + (uVar30 == 0)) << 4;
                lVar26 = 0;
                uVar25 = 0;
                auVar39 = auVar36;
                auVar44 = auVar36;
                local_f4 = iVar12;
                do {
                  ptr_02 = ptr;
                  ptr = palVar14;
                  iVar22 = ppVar5->mapper[(byte)s2[uVar25]];
                  palVar14 = ptr + (uVar30 - 1);
                  auVar7._4_8_ = in_XMM9._8_8_;
                  auVar7._0_4_ = (int)(*palVar14)[0];
                  auVar69._0_8_ = auVar7._0_8_ << 0x20;
                  auVar69._8_4_ = *(undefined4 *)((long)*palVar14 + 4);
                  auVar69._12_4_ = (int)(*palVar14)[1];
                  auVar56._4_12_ = auVar69._4_12_;
                  auVar56._0_4_ = ptr_01[uVar25];
                  lVar33 = 0;
                  lVar24 = lVar26;
                  auVar47 = auVar36;
                  do {
                    piVar2 = (int *)((long)pvVar4 + lVar33 + size * (long)iVar22 * 0x10);
                    auVar52._0_4_ = auVar56._0_4_ + *piVar2;
                    auVar52._4_4_ = auVar56._4_4_ + piVar2[1];
                    auVar52._8_4_ = auVar56._8_4_ + piVar2[2];
                    auVar52._12_4_ = auVar56._12_4_ + piVar2[3];
                    auVar56 = *(undefined1 (*) [16])((long)*ptr_00 + lVar33);
                    iVar61 = auVar56._0_4_;
                    auVar68._0_4_ = -(uint)(iVar61 < auVar52._0_4_);
                    iVar65 = auVar56._4_4_;
                    auVar68._4_4_ = -(uint)(iVar65 < auVar52._4_4_);
                    iVar66 = auVar56._8_4_;
                    auVar68._8_4_ = -(uint)(iVar66 < auVar52._8_4_);
                    iVar67 = auVar56._12_4_;
                    auVar68._12_4_ = -(uint)(iVar67 < auVar52._12_4_);
                    auVar69 = ~auVar68 & auVar56 | auVar52 & auVar68;
                    iVar23 = auVar47._0_4_;
                    auVar53._0_4_ = -(uint)(iVar23 < auVar69._0_4_);
                    iVar20 = auVar47._4_4_;
                    auVar53._4_4_ = -(uint)(iVar20 < auVar69._4_4_);
                    iVar49 = auVar47._8_4_;
                    auVar53._8_4_ = -(uint)(iVar49 < auVar69._8_4_);
                    iVar50 = auVar47._12_4_;
                    auVar53._12_4_ = -(uint)(iVar50 < auVar69._12_4_);
                    auVar69 = ~auVar53 & auVar47 | auVar69 & auVar53;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar33) = auVar69;
                    iVar51 = auVar69._0_4_;
                    auVar38._0_4_ = -(uint)(iVar51 < auVar39._0_4_);
                    iVar58 = auVar69._4_4_;
                    auVar38._4_4_ = -(uint)(iVar58 < auVar39._4_4_);
                    iVar59 = auVar69._8_4_;
                    auVar38._8_4_ = -(uint)(iVar59 < auVar39._8_4_);
                    iVar60 = auVar69._12_4_;
                    auVar38._12_4_ = -(uint)(iVar60 < auVar39._12_4_);
                    auVar39 = ~auVar38 & auVar69 | auVar39 & auVar38;
                    auVar70._0_4_ = -(uint)(iVar51 < auVar71._0_4_);
                    auVar70._4_4_ = -(uint)(iVar58 < auVar71._4_4_);
                    auVar70._8_4_ = -(uint)(iVar59 < auVar71._8_4_);
                    auVar70._12_4_ = -(uint)(iVar60 < auVar71._12_4_);
                    auVar71 = ~auVar70 & auVar71 | auVar69 & auVar70;
                    auVar73._0_4_ = -(uint)(iVar61 < auVar71._0_4_);
                    auVar73._4_4_ = -(uint)(iVar65 < auVar71._4_4_);
                    auVar73._8_4_ = -(uint)(iVar66 < auVar71._8_4_);
                    auVar73._12_4_ = -(uint)(iVar67 < auVar71._12_4_);
                    auVar71 = ~auVar73 & auVar71 | auVar56 & auVar73;
                    auVar42._0_4_ = -(uint)(iVar23 < auVar71._0_4_);
                    auVar42._4_4_ = -(uint)(iVar20 < auVar71._4_4_);
                    auVar42._8_4_ = -(uint)(iVar49 < auVar71._8_4_);
                    auVar42._12_4_ = -(uint)(iVar50 < auVar71._12_4_);
                    auVar71 = ~auVar42 & auVar71 | auVar47 & auVar42;
                    piVar2 = ((ppVar13->field_4).rowcols)->score_row;
                    *(int *)((long)piVar2 + lVar24) = iVar51;
                    *(int *)((long)piVar2 + lVar27 * 4 + lVar24) = iVar58;
                    *(int *)((long)piVar2 + lVar27 * 8 + lVar24) = iVar59;
                    *(int *)((long)piVar2 + lVar27 * 0xc + lVar24) = iVar60;
                    auVar54._0_4_ = iVar51 - open;
                    auVar54._4_4_ = iVar58 - open;
                    auVar54._8_4_ = iVar59 - open;
                    auVar54._12_4_ = iVar60 - open;
                    auVar62._0_4_ = iVar61 - gap;
                    auVar62._4_4_ = iVar65 - gap;
                    auVar62._8_4_ = iVar66 - gap;
                    auVar62._12_4_ = iVar67 - gap;
                    auVar72._0_4_ = -(uint)(auVar54._0_4_ < auVar62._0_4_);
                    auVar72._4_4_ = -(uint)(auVar54._4_4_ < auVar62._4_4_);
                    auVar72._8_4_ = -(uint)(auVar54._8_4_ < auVar62._8_4_);
                    auVar72._12_4_ = -(uint)(auVar54._12_4_ < auVar62._12_4_);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar33) =
                         ~auVar72 & auVar54 | auVar62 & auVar72;
                    auVar45._0_4_ = iVar23 - gap;
                    auVar45._4_4_ = iVar20 - gap;
                    auVar45._8_4_ = iVar49 - gap;
                    auVar45._12_4_ = iVar50 - gap;
                    auVar46._0_4_ = -(uint)(auVar54._0_4_ < auVar45._0_4_);
                    auVar46._4_4_ = -(uint)(auVar54._4_4_ < auVar45._4_4_);
                    auVar46._8_4_ = -(uint)(auVar54._8_4_ < auVar45._8_4_);
                    auVar46._12_4_ = -(uint)(auVar54._12_4_ < auVar45._12_4_);
                    auVar47 = ~auVar46 & auVar54 | auVar45 & auVar46;
                    auVar56 = *(undefined1 (*) [16])((long)*ptr + lVar33);
                    lVar33 = lVar33 + 0x10;
                    lVar24 = lVar24 + uVar18 * 4;
                  } while (lVar28 != lVar33);
                  uVar21 = 0;
                  do {
                    iVar22 = iVar19;
                    if (s2_beg == 0) {
                      iVar22 = ptr_01[uVar25 + 1] - open;
                    }
                    auVar8._4_8_ = auVar47._8_8_;
                    auVar8._0_4_ = auVar47._0_4_;
                    auVar48._0_8_ = auVar8._0_8_ << 0x20;
                    auVar48._8_4_ = auVar47._4_4_;
                    auVar48._12_4_ = auVar47._8_4_;
                    auVar47._4_12_ = auVar48._4_12_;
                    auVar47._0_4_ = iVar22;
                    bVar35 = true;
                    uVar34 = 1;
                    lVar33 = 0;
                    lVar24 = lVar26;
                    do {
                      auVar56 = *(undefined1 (*) [16])((long)*ptr_02 + lVar33);
                      auVar55._0_4_ = -(uint)(auVar47._0_4_ < auVar56._0_4_);
                      iVar22 = auVar47._4_4_;
                      auVar55._4_4_ = -(uint)(iVar22 < auVar56._4_4_);
                      iVar23 = auVar47._8_4_;
                      auVar55._8_4_ = -(uint)(iVar23 < auVar56._8_4_);
                      iVar20 = auVar47._12_4_;
                      auVar55._12_4_ = -(uint)(iVar20 < auVar56._12_4_);
                      auVar56 = ~auVar55 & auVar47 | auVar56 & auVar55;
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar33) = auVar56;
                      iVar49 = auVar56._0_4_;
                      auVar63._0_4_ = -(uint)(iVar49 < auVar71._0_4_);
                      iVar50 = auVar56._4_4_;
                      auVar63._4_4_ = -(uint)(iVar50 < auVar71._4_4_);
                      iVar51 = auVar56._8_4_;
                      auVar63._8_4_ = -(uint)(iVar51 < auVar71._8_4_);
                      iVar58 = auVar56._12_4_;
                      auVar63._12_4_ = -(uint)(iVar58 < auVar71._12_4_);
                      auVar71 = ~auVar63 & auVar71 | auVar56 & auVar63;
                      auVar40._0_4_ = -(uint)(iVar49 < auVar39._0_4_);
                      auVar40._4_4_ = -(uint)(iVar50 < auVar39._4_4_);
                      auVar40._8_4_ = -(uint)(iVar51 < auVar39._8_4_);
                      auVar40._12_4_ = -(uint)(iVar58 < auVar39._12_4_);
                      auVar39 = ~auVar40 & auVar56 | auVar39 & auVar40;
                      piVar2 = ((ppVar13->field_4).rowcols)->score_row;
                      *(int *)((long)piVar2 + lVar24) = iVar49;
                      lVar31 = (long)piVar2 + lVar24;
                      *(int *)(lVar27 * 4 + lVar31) = iVar50;
                      *(int *)(lVar27 * 8 + lVar31) = iVar51;
                      *(int *)(lVar27 * 0xc + lVar31) = iVar58;
                      auVar47._0_4_ = auVar47._0_4_ - gap;
                      auVar47._4_4_ = iVar22 - gap;
                      auVar47._8_4_ = iVar23 - gap;
                      auVar47._12_4_ = iVar20 - gap;
                      auVar64._0_4_ = -(uint)(iVar49 - open < auVar47._0_4_);
                      auVar64._4_4_ = -(uint)(iVar50 - open < auVar47._4_4_);
                      auVar64._8_4_ = -(uint)(iVar51 - open < auVar47._8_4_);
                      auVar64._12_4_ = -(uint)(iVar58 - open < auVar47._12_4_);
                      iVar22 = movmskps((int)lVar31,auVar64);
                      if (iVar22 == 0) break;
                      bVar35 = uVar34 < size;
                      lVar33 = lVar33 + 0x10;
                      lVar24 = lVar24 + uVar18 * 4;
                      uVar34 = uVar34 + 1;
                    } while (lVar28 != lVar33);
                  } while ((!bVar35) && (bVar35 = uVar21 < 3, uVar21 = uVar21 + 1, bVar35));
                  alVar43 = ptr_02[uVar16];
                  auVar57._0_4_ = -(uint)(auVar44._0_4_ < (int)alVar43[0]);
                  auVar57._4_4_ = -(uint)(auVar44._4_4_ < alVar43[0]._4_4_);
                  auVar57._8_4_ = -(uint)(auVar44._8_4_ < (int)alVar43[1]);
                  auVar57._12_4_ = -(uint)(auVar44._12_4_ < alVar43[1]._4_4_);
                  auVar6._4_4_ = -(uint)(iVar15 == 2);
                  auVar6._0_4_ = -(uint)(iVar15 == 3);
                  auVar6._8_4_ = -(uint)(iVar15 == 1);
                  auVar6._12_4_ = -(uint)(iVar15 == 0);
                  in_XMM9 = ~auVar57 & auVar44;
                  auVar44 = in_XMM9 | (undefined1  [16])alVar43 & auVar57;
                  iVar22 = movmskps(uVar16 * 0x10,auVar57 & auVar6);
                  if (iVar22 != 0) {
                    local_f4 = (int)uVar25;
                  }
                  uVar25 = uVar25 + 1;
                  lVar26 = lVar26 + 4;
                  palVar14 = ptr_02;
                  if (uVar25 == uVar32) {
                    iVar19 = iVar29;
                    iVar22 = local_f4;
                    if (s2_end != 0) {
                      if (iVar10 < 3) {
                        iVar22 = 1;
                        if (1 < iVar15) {
                          iVar22 = iVar15;
                        }
                        do {
                          lVar26 = auVar44._8_8_;
                          uVar18 = auVar44._0_8_;
                          auVar44._0_8_ = uVar18 << 0x20;
                          auVar44._8_8_ = lVar26 << 0x20 | uVar18 >> 0x20;
                          iVar22 = iVar22 + -1;
                        } while (iVar22 != 0);
                      }
                      iVar19 = auVar44._12_4_;
                    }
                    iVar23 = iVar9;
                    if ((s1_end != 0) && ((uVar1 & 0x7ffffffc) != 0)) {
                      iVar22 = (uVar30 & 0x1fffffff) << 2;
                      uVar18 = 0;
                      do {
                        iVar20 = ((uint)uVar18 & 3) * uVar30 + ((uint)(uVar18 >> 2) & 0x3fffffff);
                        iVar49 = iVar19;
                        iVar50 = local_f4;
                        iVar51 = iVar23;
                        if ((iVar20 < (int)uVar3) &&
                           (iVar58 = *(int *)((long)*ptr_02 + uVar18 * 4), iVar49 = iVar58,
                           iVar50 = iVar12, iVar51 = iVar20, iVar58 <= iVar19)) {
                          if (iVar23 <= iVar20) {
                            iVar20 = iVar23;
                          }
                          iVar49 = iVar19;
                          iVar50 = local_f4;
                          iVar51 = iVar23;
                          if (local_f4 == iVar12 && iVar58 == iVar19) {
                            iVar51 = iVar20;
                          }
                        }
                        iVar23 = iVar51;
                        local_f4 = iVar50;
                        iVar19 = iVar49;
                        uVar18 = uVar18 + 1;
                      } while (iVar22 != (int)uVar18);
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      iVar22 = uVar16 * 0x10;
                      alVar43 = ptr_02[uVar16];
                      if (iVar10 < 3) {
                        iVar22 = 1;
                        if (1 < iVar15) {
                          iVar22 = iVar15;
                        }
                        do {
                          lVar26 = alVar43[1];
                          uVar18 = alVar43[0];
                          alVar43[0] = uVar18 << 0x20;
                          alVar43[1] = lVar26 << 0x20 | uVar18 >> 0x20;
                          iVar22 = iVar22 + -1;
                        } while (iVar22 != 0);
                      }
                      iVar19 = alVar43[1]._4_4_;
                      local_f4 = iVar12;
                      iVar23 = iVar9;
                    }
                    auVar37._0_4_ = -(uint)(auVar71._0_4_ < iVar29);
                    auVar37._4_4_ = -(uint)(auVar71._4_4_ < iVar29);
                    auVar37._8_4_ = -(uint)(auVar71._8_4_ < iVar29);
                    auVar37._12_4_ = -(uint)(auVar71._12_4_ < iVar29);
                    auVar41._0_4_ = -(uint)(iVar11 < auVar39._0_4_);
                    auVar41._4_4_ = -(uint)(iVar11 < auVar39._4_4_);
                    auVar41._8_4_ = -(uint)(iVar11 < auVar39._8_4_);
                    auVar41._12_4_ = -(uint)(iVar11 < auVar39._12_4_);
                    iVar11 = movmskps(iVar22,auVar41 | auVar37);
                    if (iVar11 != 0) {
                      *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
                      iVar19 = 0;
                      local_f4 = 0;
                      iVar23 = 0;
                    }
                    ppVar13->score = iVar19;
                    ppVar13->end_query = iVar23;
                    ppVar13->end_ref = local_f4;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_02);
                    return ppVar13;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32_rpl(vH, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}